

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_LittleFourWinds_Test::testBody
          (TEST_DoublingFactorCounterTest_LittleFourWinds_Test *this)

{
  size_type sVar1;
  size_type sVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  unsigned_long in_stack_fffffffffffffe48;
  undefined4 uVar7;
  undefined8 uVar6;
  NormalTestTerminator *this_00;
  int value;
  NormalTestTerminator local_108;
  NormalTestTerminator local_100;
  SimpleString local_f8;
  SimpleString local_f0;
  NormalTestTerminator local_e8;
  NormalTestTerminator local_e0;
  key_type local_d4;
  SimpleString local_d0;
  SimpleString local_c8;
  key_type local_bc [6];
  key_type local_a4;
  undefined1 local_a0 [8];
  DoublingFactorReport r;
  TEST_DoublingFactorCounterTest_LittleFourWinds_Test *this_local;
  
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,EastWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,SouthWind,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,WestWind,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,NorthWind,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfCharacters,false);
  r.doubling_factor = 0;
  mahjong::WiningState::selfDrawn
            (&(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s,
             (SelfDrawnSituation)0x0);
  mahjong::DoubligFactorCounter::report
            ((DoublingFactorReport *)local_a0,
             &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c);
  local_a4 = LittleFourWinds;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,&local_a4);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_e8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    this_00 = &local_e8;
    NormalTestTerminator::NormalTestTerminator(this_00);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x347);
    value = (int)((ulong)this_00 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1af460);
  }
  else {
    local_bc[1] = 0x2e;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc + 1);
    local_bc[0] = LittleFourWinds;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_bc);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x347);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)(in_stack_fffffffffffffe48 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_c8);
    local_d4 = LittleFourWinds;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_d4);
    StringFrom(in_stack_fffffffffffffe48);
    uVar7 = (undefined4)(in_stack_fffffffffffffe48 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_d0);
    local_e0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_e0);
    uVar6 = CONCAT44(uVar7,0x347);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,uVar6,&local_e0);
    value = (int)((ulong)uVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1af374);
    SimpleString::~SimpleString((SimpleString *)0x1af380);
    SimpleString::~SimpleString((SimpleString *)0x1af38c);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 100) {
    pUVar3 = UtestShell::getCurrent();
    local_108.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_108);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x348,&local_108);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1af68d);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_f0);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_f8);
    local_100.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_100);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,CONCAT44(value,0x348),&local_100);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1af5a1);
    SimpleString::~SimpleString((SimpleString *)0x1af5ad);
    SimpleString::~SimpleString((SimpleString *)0x1af5b9);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport((DoublingFactorReport *)local_a0);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, LittleFourWinds)
{
	addPair(Tile::EastWind);
	addTriplet(Tile::SouthWind, false);
	addTriplet(Tile::WestWind, false);
	addTriplet(Tile::NorthWind, false);
	addSequence(Tile::TwoOfCharacters, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::LittleFourWinds));
	CHECK_EQUAL(100, r.doubling_factor);
}